

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O2

TestStatus *
vkt::synchronization::anon_unknown_0::singleSubmissionCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deUint32 queueFamilyIndex;
  VkResult result;
  int iVar1;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue pVVar2;
  long lVar3;
  allocator<char> local_159;
  VkCommandBuffer cmdBuffers [2];
  string local_148;
  RefBase<vk::Handle<(vk::HandleType)10>_> local_128;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_108;
  RefBase<vk::Handle<(vk::HandleType)6>_> local_e8;
  VkSubmitInfo submitInfo;
  Move<vk::VkCommandBuffer_s_*> ptrCmdBuffer [2];
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  pVVar2 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_e8.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_e8.m_data.object.m_internal = submitInfo._0_8_;
  local_e8.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&submitInfo);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  local_108.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_108.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_108.m_data.object.m_internal = submitInfo._0_8_;
  local_108.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&submitInfo);
  makeCommandBuffer(ptrCmdBuffer,vk,device,(VkCommandPool)local_108.m_data.object.m_internal);
  makeCommandBuffer(ptrCmdBuffer + 1,vk,device,(VkCommandPool)local_108.m_data.object.m_internal);
  submitInfo.pCommandBuffers = cmdBuffers;
  cmdBuffers[0] = ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  cmdBuffers[1] = ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 2;
  submitInfo._44_4_ = 0;
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&local_148,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_128.m_data.deleter.m_device = (VkDevice)local_148.field_2._M_allocated_capacity;
  local_128.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_148.field_2._8_8_;
  local_128.m_data.object.m_internal = (deUint64)local_148._M_dataplus._M_p;
  local_128.m_data.deleter.m_deviceIface = (DeviceInterface *)local_148._M_string_length;
  local_148._M_dataplus._M_p = (pointer)0x0;
  local_148._M_string_length = 0;
  local_148.field_2._M_allocated_capacity = 0;
  local_148.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)10>_> *)&local_148);
  beginCommandBuffer(vk,cmdBuffers[0]);
  (*vk->_vptr_DeviceInterface[0x6a])(vk,cmdBuffers[0],local_128.m_data.object.m_internal,1);
  endCommandBuffer(vk,cmdBuffers[0]);
  beginCommandBuffer(vk,cmdBuffers[1]);
  (*vk->_vptr_DeviceInterface[0x6c])(vk,cmdBuffers[1],1,&local_128,1,0x10000,0,0,0,0,0,0);
  endCommandBuffer(vk,cmdBuffers[1]);
  result = (*vk->_vptr_DeviceInterface[2])
                     (vk,pVVar2,1,&submitInfo,local_e8.m_data.object.m_internal);
  ::vk::checkResult(result,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0xcc);
  iVar1 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_e8,1,0xffffffffffffffff);
  if (iVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"Wait and set even on device single submission tests pass",
               &local_159);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_148);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"Queue should end execution",&local_159);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_148);
  }
  std::__cxx11::string::~string((string *)&local_148);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase(&local_128);
  lVar3 = 0x20;
  do {
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
              ((RefBase<vk::VkCommandBuffer_s_*> *)
               ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + lVar3)
              );
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_108);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus singleSubmissionCase (Context& context)
{
	enum {SET=0, WAIT, COUNT};
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	const Unique<VkFence>			fence				(createFence(vk, device));
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Move<VkCommandBuffer>		ptrCmdBuffer[COUNT]	= {makeCommandBuffer(vk, device, *cmdPool), makeCommandBuffer(vk, device, *cmdPool)};
	VkCommandBuffer					cmdBuffers[COUNT]	= {*ptrCmdBuffer[SET], *ptrCmdBuffer[WAIT]};
	const VkSubmitInfo				submitInfo			=
														{
															VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
															DE_NULL,						// const void*					pNext;
															0u,								// deUint32						waitSemaphoreCount;
															DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
															DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
															2u,								// deUint32						commandBufferCount;
															cmdBuffers,						// const VkCommandBuffer*		pCommandBuffers;
															0u,								// deUint32						signalSemaphoreCount;
															DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
														};
	const Unique<VkEvent>			event				(createEvent(vk, device));

	beginCommandBuffer(vk, cmdBuffers[SET]);
	vk.cmdSetEvent(cmdBuffers[SET], *event, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT);
	endCommandBuffer(vk, cmdBuffers[SET]);

	beginCommandBuffer(vk, cmdBuffers[WAIT]);
	vk.cmdWaitEvents(cmdBuffers[WAIT], 1u, &event.get(),VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, 0u, DE_NULL, 0u, DE_NULL, 0u, DE_NULL);
	endCommandBuffer(vk, cmdBuffers[WAIT]);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	if (VK_SUCCESS != vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should end execution");

	return tcu::TestStatus::pass("Wait and set even on device single submission tests pass");
}